

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap2d_qualities.cpp
# Opt level: O0

Reals __thiscall
Omega_h::swap2d_qualities_tmpl<2>(Omega_h *this,Mesh *mesh,AdaptOpts *opts,LOs *cands2edges)

{
  void **__return_storage_ptr__;
  LO size_in;
  void *extraout_RDX;
  Int ent_dim;
  Reals RVar1;
  Read<int> local_278;
  Read<double> local_268;
  Write<double> local_258;
  undefined1 local_248 [8];
  Reals cand_quals;
  type f;
  string local_168 [32];
  undefined1 local_148 [8];
  Write<double> cand_quals_w;
  LO ncands;
  Real max_length;
  MetricEdgeLengths<2,_2> length_measure;
  MetricElementQualities<2,_2> quality_measure;
  Read<signed_char> edges_are_owned;
  LOs tri_verts2verts;
  LOs edge_verts2verts;
  Read<signed_char> et_codes;
  LOs et2t;
  undefined1 local_88 [8];
  LOs e2et;
  Adj e2t;
  LOs *cands2edges_local;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  ulong local_10;
  
  __return_storage_ptr__ = &e2et.write_.shared_alloc_.direct_ptr;
  e2t.codes.write_.shared_alloc_.direct_ptr = cands2edges;
  Mesh::ask_up((Adj *)__return_storage_ptr__,mesh,1,2);
  Read<int>::Read((Read<int> *)local_88,(Read<int> *)__return_storage_ptr__);
  Read<int>::Read((Read<int> *)&et_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2t.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&e2t.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
  ent_dim = (Int)mesh;
  Mesh::ask_verts_of((Mesh *)&tri_verts2verts.write_.shared_alloc_.direct_ptr,ent_dim);
  Mesh::ask_verts_of((Mesh *)&edges_are_owned.write_.shared_alloc_.direct_ptr,ent_dim);
  Mesh::owned((Mesh *)&quality_measure.metrics.write_.shared_alloc_.direct_ptr,ent_dim);
  MetricElementQualities<2,_2>::MetricElementQualities
            ((MetricElementQualities<2,_2> *)&length_measure.metrics.write_.shared_alloc_.direct_ptr
             ,mesh);
  MetricEdgeLengths<2,_2>::MetricEdgeLengths((MetricEdgeLengths<2,_2> *)&max_length,mesh);
  f.length_measure.metrics.write_.shared_alloc_.direct_ptr = (void *)opts->max_length_allowed;
  if (((ulong)(cands2edges->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((cands2edges->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(cands2edges->write_).shared_alloc_.alloc >> 3;
  }
  size_in = (LO)(local_10 >> 2);
  cand_quals_w.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,"",
             (allocator *)((long)&f.quality_measure.metrics.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_148,size_in,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&f.quality_measure.metrics.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)&cand_quals.write_.shared_alloc_.direct_ptr,cands2edges);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.cands2edges.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&quality_measure.metrics.write_.shared_alloc_.direct_ptr);
  Write<double>::Write
            ((Write<double> *)&f.edges_are_owned.write_.shared_alloc_.direct_ptr,
             (Write<double> *)local_148);
  Read<int>::Read((Read<int> *)&f.cand_quals_w.shared_alloc_.direct_ptr,(Read<int> *)local_88);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.e2et.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.et_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&et_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.et2t.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&edges_are_owned.write_.shared_alloc_.direct_ptr);
  MetricEdgeLengths<2,_2>::MetricEdgeLengths
            ((MetricEdgeLengths<2,_2> *)&f.tri_verts2verts.write_.shared_alloc_.direct_ptr,
             (MetricEdgeLengths<3,_3> *)&max_length);
  Read<int>::Read((Read<int> *)&f.max_length,
                  (Read<int> *)&tri_verts2verts.write_.shared_alloc_.direct_ptr);
  MetricElementQualities<2,_2>::MetricElementQualities
            ((MetricElementQualities<2,_2> *)&f.edge_verts2verts.write_.shared_alloc_.direct_ptr,
             (MetricElementQualities<3,_3> *)&length_measure.metrics.write_.shared_alloc_.direct_ptr
            );
  parallel_for<Omega_h::swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::_lambda(int)_1_>
            (cand_quals_w.shared_alloc_.direct_ptr._4_4_,
             (type *)&cand_quals.write_.shared_alloc_.direct_ptr,"swap2d_qualities");
  Write<double>::Write(&local_258,(Write<double> *)local_148);
  Read<double>::Read((Read<double> *)local_248,&local_258);
  Write<double>::~Write(&local_258);
  Read<double>::Read(&local_268,(Read<double> *)local_248);
  Read<int>::Read(&local_278,cands2edges);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,ent_dim,(Read<double> *)0x1,(LOs *)&local_268,-1.0,(Int)&local_278);
  Read<int>::~Read(&local_278);
  Read<double>::~Read(&local_268);
  Read<double>::~Read((Read<double> *)local_248);
  swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::
  {lambda(int)#1}::~AdaptOpts((_lambda_int__1_ *)&cand_quals.write_.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_148);
  MetricEdgeLengths<2,_2>::~MetricEdgeLengths((MetricEdgeLengths<2,_2> *)&max_length);
  MetricElementQualities<2,_2>::~MetricElementQualities
            ((MetricElementQualities<2,_2> *)&length_measure.metrics.write_.shared_alloc_.direct_ptr
            );
  Read<signed_char>::~Read
            ((Read<signed_char> *)&quality_measure.metrics.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&edges_are_owned.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&tri_verts2verts.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&et_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_88);
  Adj::~Adj((Adj *)&e2et.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals swap2d_qualities_tmpl(
    Mesh* mesh, AdaptOpts const& opts, LOs cands2edges) {
  auto e2t = mesh->ask_up(EDGE, FACE);
  auto e2et = e2t.a2ab;
  auto et2t = e2t.ab2b;
  auto et_codes = e2t.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tri_verts2verts = mesh->ask_verts_of(FACE);
  auto edges_are_owned = mesh->owned(EDGE);
  auto quality_measure = MetricElementQualities<2, metric_dim>(mesh);
  auto length_measure = MetricEdgeLengths<2, metric_dim>(mesh);
  auto max_length = opts.max_length_allowed;
  auto ncands = cands2edges.size();
  auto cand_quals_w = Write<Real>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto edge = cands2edges[cand];
    /* non-owned edges will have incomplete cavities
       and will run into the topological assertions
       in find_loop(). don't bother; their results
       will be overwritten by the owner's anyways */
    if (!edges_are_owned[edge]) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    OMEGA_H_CHECK(e2et[edge + 1] == 2 + e2et[edge]);
    LO t[2];
    Few<LO, 2> ov;
    for (Int i = 0; i < 2; ++i) {
      auto et = e2et[edge] + i;
      auto code = et_codes[et];
      auto tte = code_which_down(code);
      auto rot = code_rotation(code);
      t[rot] = et2t[et];
      auto ttv = simplex_opposite_template(FACE, EDGE, tte);
      ov[rot] = tri_verts2verts[t[rot] * 3 + ttv];
    }
    auto l = length_measure.measure(ov);
    if (l > max_length) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    auto ev = gather_verts<2>(edge_verts2verts, edge);
    Real minqual = 1.0;
    for (Int i = 0; i < 2; ++i) {
      Few<LO, 3> ntv;
      ntv[0] = ev[1 - i];
      ntv[1] = ov[i];
      ntv[2] = ov[1 - i];
      auto qual = quality_measure.measure(ntv);
      minqual = min2(minqual, qual);
    }
    cand_quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "swap2d_qualities");
  auto cand_quals = Reals(cand_quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, cands2edges, -1.0, 1);
}